

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol_check_data.h
# Opt level: O2

pair<bool,_double> __thiscall mp::Violation::Check(Violation *this,double epsabs,double epsrel)

{
  double dVar1;
  undefined8 in_RAX;
  double dVar2;
  pair<bool,_double> pVar3;
  
  if (epsabs < this->viol_) {
    dVar1 = this->valX_;
    dVar2 = 0.0;
    pVar3._1_7_ = (undefined7)((ulong)in_RAX >> 8);
    pVar3.first = true;
    if (((dVar1 == 0.0) && (!NAN(dVar1))) || (dVar2 = ABS(this->viol_ / dVar1), epsrel < dVar2)) {
      pVar3.second = dVar2;
      return pVar3;
    }
  }
  return (pair<bool,_double>)ZEXT816(0);
}

Assistant:

std::pair<bool, double> Check(
      double epsabs, double epsrel) const {
    double violRel {0.0};
    if (viol_ > epsabs
        && (!valX_
            || (violRel=std::fabs(viol_/valX_))>epsrel))
      return {true, violRel};
    return {false, 0.0};
  }